

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferred
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  size_t *__s;
  pointer pvVar1;
  pointer pBVar2;
  size_t sVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  unsigned_long uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  size_t **ppsVar12;
  size_t *psVar13;
  size_t *psVar14;
  BlockInfo *b;
  pointer pBVar15;
  pointer puVar16;
  _Hash_node_base *p_Var17;
  size_t sVar18;
  CoreDims local_600;
  undefined1 local_5f0 [16];
  CoreDims local_5e0;
  undefined1 local_5d0 [16];
  CoreDims local_5c0;
  undefined1 local_5b0 [16];
  CoreDims local_5a0;
  undefined1 local_590 [16];
  DimsArray vStart;
  DimsArray vCount;
  DimsArray vMemCount;
  DimsArray vMemStart;
  DimsArray vShape;
  
  if (*(int *)(variable + 0x28) == 0xe) {
    if ((((this->super_SscReaderBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      GetDeferredDeltaCommon(this,variable,data);
      return;
    }
    p_Var17 = (this->m_AllReceivingWriterRanks)._M_h._M_before_begin._M_nxt;
    if (p_Var17 != (_Hash_node_base *)0x0) {
      do {
        pvVar1 = (this->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = *(pointer *)
                  ((long)&pvVar1[*(int *)&p_Var17[1]._M_nxt].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pBVar15 = pvVar1[*(int *)&p_Var17[1]._M_nxt].
                       super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar15 != pBVar2;
            pBVar15 = pBVar15 + 1) {
          sVar3 = (pBVar15->name)._M_string_length;
          if ((sVar3 == *(size_t *)(variable + 0x10)) &&
             ((sVar3 == 0 ||
              (iVar10 = bcmp((pBVar15->name)._M_dataplus._M_p,*(void **)(variable + 8),sVar3),
              iVar10 == 0)))) {
            vStart.super_CoreDims.DimCount = (size_t)vStart.Dimensions;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                      ((string *)&vStart,
                       (pBVar15->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       *(pointer *)
                        ((long)&(pBVar15->value).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl + 8));
            std::__cxx11::string::operator=((string *)data,(string *)&vStart);
            if ((size_t *)vStart.super_CoreDims.DimCount != vStart.Dimensions) {
              operator_delete((void *)vStart.super_CoreDims.DimCount);
            }
          }
        }
        p_Var17 = p_Var17->_M_nxt;
      } while (p_Var17 != (_Hash_node_base *)0x0);
    }
  }
  else {
    lVar4 = *(long *)(variable + 0x70);
    lVar11 = *(long *)(variable + 0x78);
    sVar18 = lVar11 - lVar4 >> 3;
    vStart.super_CoreDims.DimensSpan = vStart.Dimensions;
    vStart.super_CoreDims.DimCount = sVar18;
    memset(vStart.super_CoreDims.DimensSpan,0,0x100);
    if (lVar11 != lVar4) {
      lVar11 = 0;
      do {
        vStart.Dimensions[lVar11] = *(size_t *)(lVar4 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (sVar18 + (sVar18 == 0) != lVar11);
    }
    lVar4 = *(long *)(variable + 0x88);
    lVar11 = *(long *)(variable + 0x90);
    sVar18 = lVar11 - lVar4 >> 3;
    vCount.super_CoreDims.DimensSpan = vCount.Dimensions;
    vCount.super_CoreDims.DimCount = sVar18;
    memset(vCount.super_CoreDims.DimensSpan,0,0x100);
    if (lVar11 != lVar4) {
      lVar11 = 0;
      do {
        vCount.Dimensions[lVar11] = *(size_t *)(lVar4 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (sVar18 + (sVar18 == 0) != lVar11);
    }
    lVar4 = *(long *)(variable + 0x58);
    lVar11 = *(long *)(variable + 0x60);
    sVar18 = lVar11 - lVar4 >> 3;
    vShape.super_CoreDims.DimensSpan = vShape.Dimensions;
    vShape.super_CoreDims.DimCount = sVar18;
    memset(vShape.super_CoreDims.DimensSpan,0,0x100);
    if (lVar11 != lVar4) {
      lVar11 = 0;
      do {
        vShape.Dimensions[lVar11] = *(size_t *)(lVar4 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (sVar18 + (sVar18 == 0) != lVar11);
    }
    lVar4 = *(long *)(variable + 0xa0);
    lVar11 = *(long *)(variable + 0xa8);
    sVar18 = lVar11 - lVar4 >> 3;
    psVar14 = vMemStart.Dimensions;
    vMemStart.super_CoreDims.DimCount = sVar18;
    vMemStart.super_CoreDims.DimensSpan = psVar14;
    memset(psVar14,0,0x100);
    if (lVar11 != lVar4) {
      lVar11 = 0;
      do {
        vMemStart.Dimensions[lVar11] = *(size_t *)(lVar4 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (sVar18 + (sVar18 == 0) != lVar11);
    }
    lVar4 = *(long *)(variable + 0xb8);
    lVar11 = *(long *)(variable + 0xc0);
    sVar18 = lVar11 - lVar4 >> 3;
    __s = vMemCount.Dimensions;
    vMemCount.super_CoreDims.DimCount = sVar18;
    vMemCount.super_CoreDims.DimensSpan = __s;
    memset(__s,0,0x100);
    if (lVar11 != lVar4) {
      lVar11 = 0;
      do {
        vMemCount.Dimensions[lVar11] = *(size_t *)(lVar4 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (sVar18 + (sVar18 == 0) != lVar11);
    }
    if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
      ppsVar12 = (size_t **)(vStart.Dimensions + (vStart.super_CoreDims.DimCount - 1));
      if (vStart.Dimensions < ppsVar12 && vStart.super_CoreDims.DimCount != 0) {
        psVar13 = vStart.Dimensions;
        do {
          psVar13 = psVar13 + 1;
          sVar18 = psVar13[-1];
          psVar13[-1] = (size_t)*ppsVar12;
          *ppsVar12 = (size_t *)sVar18;
          ppsVar12 = ppsVar12 + -1;
        } while (psVar13 < ppsVar12);
      }
      ppsVar12 = (size_t **)(vCount.Dimensions + (vCount.super_CoreDims.DimCount - 1));
      if (vCount.Dimensions < ppsVar12 && vCount.super_CoreDims.DimCount != 0) {
        psVar13 = vCount.Dimensions;
        do {
          psVar13 = psVar13 + 1;
          sVar18 = psVar13[-1];
          psVar13[-1] = (size_t)*ppsVar12;
          *ppsVar12 = (size_t *)sVar18;
          ppsVar12 = ppsVar12 + -1;
        } while (psVar13 < ppsVar12);
      }
      ppsVar12 = (size_t **)(vShape.Dimensions + (vShape.super_CoreDims.DimCount - 1));
      if (vShape.Dimensions < ppsVar12 && vShape.super_CoreDims.DimCount != 0) {
        psVar13 = vShape.Dimensions;
        do {
          psVar13 = psVar13 + 1;
          sVar18 = psVar13[-1];
          psVar13[-1] = (size_t)*ppsVar12;
          *ppsVar12 = (size_t *)sVar18;
          ppsVar12 = ppsVar12 + -1;
        } while (psVar13 < ppsVar12);
      }
      ppsVar12 = (size_t **)(vMemStart.Dimensions + (vMemStart.super_CoreDims.DimCount - 1));
      if (psVar14 < ppsVar12 && vMemStart.super_CoreDims.DimCount != 0) {
        psVar14 = vMemStart.Dimensions;
        do {
          psVar14 = psVar14 + 1;
          sVar18 = psVar14[-1];
          psVar14[-1] = (size_t)*ppsVar12;
          *ppsVar12 = (size_t *)sVar18;
          ppsVar12 = ppsVar12 + -1;
        } while (psVar14 < ppsVar12);
      }
      ppsVar12 = (size_t **)(vMemCount.Dimensions + (vMemCount.super_CoreDims.DimCount - 1));
      if (__s < ppsVar12 && vMemCount.super_CoreDims.DimCount != 0) {
        psVar14 = vMemCount.Dimensions;
        do {
          psVar14 = psVar14 + 1;
          sVar18 = psVar14[-1];
          psVar14[-1] = (size_t)*ppsVar12;
          *ppsVar12 = (size_t *)sVar18;
          ppsVar12 = ppsVar12 + -1;
        } while (psVar14 < ppsVar12);
      }
    }
    if ((((this->super_SscReaderBase).m_CurrentStep == 0) ||
        (this->m_WriterDefinitionsLocked == false)) || (this->m_ReaderSelectionsLocked == false)) {
      GetDeferredDeltaCommon(this,variable,data);
    }
    else {
      for (p_Var17 = (this->m_AllReceivingWriterRanks)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        pvVar1 = (this->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = *(pointer *)
                  ((long)&pvVar1[*(int *)&p_Var17[1]._M_nxt].
                          super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pBVar15 = pvVar1[*(int *)&p_Var17[1]._M_nxt].
                       super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start; pBVar15 != pBVar2;
            pBVar15 = pBVar15 + 1) {
          sVar3 = (pBVar15->name)._M_string_length;
          if ((sVar3 == *(size_t *)(variable + 0x10)) &&
             ((sVar3 == 0 ||
              (iVar10 = bcmp((pBVar15->name)._M_dataplus._M_p,*(void **)(variable + 8),sVar3),
              iVar10 == 0)))) {
            puVar5 = (pBVar15->count).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar6 = *(pointer *)
                      ((long)&(pBVar15->count).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8);
            if (puVar5 != puVar6) {
              puVar16 = puVar5;
              bVar9 = 0;
              do {
                bVar8 = bVar9;
                uVar7 = *puVar16;
                puVar16 = puVar16 + 1;
                bVar9 = bVar8 | uVar7 == 0;
              } while (puVar16 != puVar6);
              if ((bool)(bVar8 | uVar7 == 0)) goto LAB_00147c66;
            }
            switch(pBVar15->shapeId) {
            case GlobalValue:
            case LocalValue:
              memcpy(data,(this->super_SscReaderBase).m_Buffer.m_Buffer + pBVar15->bufferStart,
                     pBVar15->bufferCount);
              break;
            case GlobalArray:
            case LocalArray:
              local_5e0.DimensSpan =
                   (pBVar15->start).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_5e0.DimCount =
                   (long)*(pointer *)
                          ((long)&(pBVar15->start).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl + 8) - (long)local_5e0.DimensSpan >> 3;
              local_600.DimCount = (long)puVar6 - (long)puVar5 >> 3;
              local_600.DimensSpan = puVar5;
              local_5c0.DimCount = local_600.DimCount;
              local_5c0.DimensSpan = puVar5;
              local_5a0.DimCount = local_5e0.DimCount;
              local_5a0.DimensSpan = local_5e0.DimensSpan;
              adios2::helper::NdCopy
                        ((char *)((this->super_SscReaderBase).m_Buffer.m_Buffer +
                                 pBVar15->bufferStart),&local_5a0,&local_5c0,true,true,(char *)data,
                         &vStart.super_CoreDims,&vCount.super_CoreDims,true,true,
                         *(int *)(variable + 0x30),&local_5e0,&local_600,&vMemStart.super_CoreDims,
                         &vMemCount.super_CoreDims,false,Host,false);
              break;
            default:
              local_5a0.DimCount = (size_t)local_590;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"Engine","");
              local_5c0.DimCount = (size_t)local_5b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5c0,"SscReaderGeneric","");
              local_5e0.DimCount = (size_t)local_5d0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_5e0,"GetDeferredCommon","");
              local_600.DimCount = (size_t)local_5f0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_600,"unknown ShapeID","");
              iVar10 = (this->super_SscReaderBase).m_ReaderRank;
              adios2::helper::Log((string *)&local_5a0,(string *)&local_5c0,(string *)&local_5e0,
                                  (string *)&local_600,iVar10,iVar10,0,
                                  (this->super_SscReaderBase).m_Verbosity,FATALERROR);
              if ((undefined1 *)local_600.DimCount != local_5f0) {
                operator_delete((void *)local_600.DimCount);
              }
              if ((undefined1 *)local_5e0.DimCount != local_5d0) {
                operator_delete((void *)local_5e0.DimCount);
              }
              if ((undefined1 *)local_5c0.DimCount != local_5b0) {
                operator_delete((void *)local_5c0.DimCount);
              }
              if ((undefined1 *)local_5a0.DimCount != local_590) {
                operator_delete((void *)local_5a0.DimCount);
              }
            }
          }
LAB_00147c66:
        }
      }
    }
  }
  return;
}

Assistant:

void SscReaderGeneric::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *dataString = reinterpret_cast<std::string *>(data);
        if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
            m_ReaderSelectionsLocked == false)
        {
            GetDeferredDeltaCommon(variable, data);
        }
        else
        {
            for (const auto &i : m_AllReceivingWriterRanks)
            {
                const auto &v = m_GlobalWritePattern[i.first];
                for (const auto &b : v)
                {
                    if (b.name == variable.m_Name)
                    {
                        *dataString = std::string(b.value.begin(), b.value.end());
                    }
                }
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vShape(variable.m_Shape);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    if (m_CurrentStep == 0 || m_WriterDefinitionsLocked == false ||
        m_ReaderSelectionsLocked == false)
    {
        GetDeferredDeltaCommon(variable, data);
    }
    else
    {

        for (const auto &i : m_AllReceivingWriterRanks)
        {
            const auto &v = m_GlobalWritePattern[i.first];
            for (const auto &b : v)
            {
                if (b.name == variable.m_Name)
                {
                    bool empty = false;
                    for (const auto c : b.count)
                    {
                        if (c == 0)
                        {
                            empty = true;
                        }
                    }
                    if (empty)
                    {
                        continue;
                    }

                    if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
                    {
                        helper::NdCopy(m_Buffer.data<char>() + b.bufferStart,
                                       helper::CoreDims(b.start), helper::CoreDims(b.count), true,
                                       true, reinterpret_cast<char *>(data), vStart, vCount, true,
                                       true, static_cast<int>(variable.m_ElementSize),
                                       helper::CoreDims(b.start), helper::CoreDims(b.count),
                                       vMemStart, vMemCount);
                    }
                    else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                    {
                        std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
                    }
                    else
                    {
                        helper::Log("Engine", "SscReaderGeneric", "GetDeferredCommon",
                                    "unknown ShapeID", m_ReaderRank, m_ReaderRank, 0, m_Verbosity,
                                    helper::LogMode::FATALERROR);
                    }
                }
            }
        }
    }
}